

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_roxr_16_ai(void)

{
  uint address;
  uint value;
  uint uVar1;
  uint uVar2;
  uint res;
  uint src;
  uint ea;
  
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar1 = m68ki_read_16_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  uVar2 = (m68ki_cpu.x_flag >> 8 & 1) << 0x10;
  m68ki_cpu.x_flag = ((uVar1 | uVar2) >> 1 | uVar1 << 0x10) >> 8;
  uVar2 = uVar1 & 0x1fffe | uVar2;
  value = uVar2 >> 1;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = uVar2 >> 9;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_roxr_16_ai(void)
{
	uint ea = EA_AY_AI_16();
	uint src = m68ki_read_16(ea);
	uint res = ROR_17(src | (XFLAG_AS_1() << 16), 1);

	FLAG_C = FLAG_X = res >> 8;
	res = MASK_OUT_ABOVE_16(res);

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
}